

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *table)

{
  ImVector<ImDrawChannel> *this;
  char cVar1;
  char cVar2;
  ImS16 IVar3;
  undefined2 uVar4;
  uint uVar5;
  unsigned_short *puVar6;
  int iVar7;
  int iVar8;
  ImGuiContext *pIVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  bool bVar14;
  short sVar15;
  int n;
  uint uVar16;
  ImGuiTableColumn *pIVar17;
  ImDrawChannel *pIVar18;
  ImDrawCmd *pIVar19;
  ImDrawChannel *pIVar20;
  long lVar21;
  ImRect *this_00;
  int n_2;
  int iVar22;
  ImBitArray<130> *pIVar23;
  int merge_group_sub_n;
  int iVar24;
  int iVar25;
  ulong uVar26;
  int n_1;
  int iVar27;
  int iVar28;
  long lVar30;
  ImRect merge_clip_rect;
  ImBitArray<130> remaining_mask;
  ImRect local_d8;
  int local_c8;
  ImBitArray<130> local_c4 [7];
  ulong uVar29;
  
  pIVar9 = GImGui;
  cVar1 = table->FreezeRowsCount;
  cVar2 = table->FreezeColumnsCount;
  uVar26 = 0;
  memset(&local_d8,0,0xa0);
  uVar5 = table->Flags;
  this = &(table->DrawSplitter)._Channels;
  uVar16 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar26) {
      if (uVar16 != 0) {
        ImVector<ImDrawChannel>::resize
                  (&pIVar9->DrawChannelsTempMergeBuffer,(table->DrawSplitter)._Count + -1);
        pIVar18 = (pIVar9->DrawChannelsTempMergeBuffer).Data;
        remaining_mask.Storage[4] = 0;
        remaining_mask.Storage[0] = 0;
        remaining_mask.Storage[1] = 0;
        remaining_mask.Storage[2] = 0;
        remaining_mask.Storage[3] = 0;
        ImBitArraySetBitRange(remaining_mask.Storage,1,(table->DrawSplitter)._Count + -1);
        iVar22 = (table->DrawSplitter)._Count;
        iVar24 = iVar22 + -1;
        pIVar23 = local_c4;
        for (lVar30 = 0; lVar30 != 4; lVar30 = lVar30 + 1) {
          lVar21 = lVar30 * 0x28;
          iVar25 = (&local_c8)[lVar30 * 10];
          if (iVar25 != 0) {
            merge_clip_rect.Min.x = *(float *)((long)&local_d8 + lVar21);
            merge_clip_rect.Min.y = *(float *)((long)&local_d8 + lVar21 + 4);
            merge_clip_rect.Max.x = *(float *)((long)&local_d8 + lVar21 + 8);
            merge_clip_rect.Max.y = *(float *)((long)&local_d8 + lVar21 + 0xc);
            iVar27 = iVar25;
            if (uVar16 == 8 && (cVar1 < '\x01' && cVar2 < '\x01')) {
              if (lVar30 != 3) {
                LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                            ,0x2448,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                            "merge_group_n == 3");
              }
              ImRect::Add(&merge_clip_rect,
                          (ImRect *)
                          (table->RowBgColor + (ulong)((uVar5 >> 0x12 & 1) == 0) * 8 + 0x1a));
              iVar27 = (&local_c8)[lVar30 * 10];
            }
            for (lVar21 = 0; lVar21 != 5; lVar21 = lVar21 + 1) {
              remaining_mask.Storage[lVar21] =
                   remaining_mask.Storage[lVar21] & ~pIVar23->Storage[lVar21];
            }
            iVar28 = 0;
            while ((iVar22 = (table->DrawSplitter)._Count, iVar28 < iVar22 && (iVar25 != 0))) {
              bVar14 = ImBitArray<130>::TestBit(local_c4 + lVar30 * 2,iVar28);
              if (bVar14) {
                ImBitArray<130>::ClearBit(local_c4 + lVar30 * 2,iVar28);
                pIVar20 = ImVector<ImDrawChannel>::operator[](this,iVar28);
                if (((((pIVar20->_CmdBuffer).Size != 1) ||
                     (pIVar19 = ImVector<ImDrawCmd>::operator[](&pIVar20->_CmdBuffer,0),
                     (pIVar19->ClipRect).x < merge_clip_rect.Min.x)) ||
                    ((pIVar19->ClipRect).y < merge_clip_rect.Min.y)) ||
                   ((merge_clip_rect.Max.x < (pIVar19->ClipRect).z ||
                    (merge_clip_rect.Max.y < (pIVar19->ClipRect).w)))) {
                  LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                              ,0x245b,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                              "channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect))"
                             );
                }
                fVar13 = merge_clip_rect.Max.y;
                fVar12 = merge_clip_rect.Max.x;
                fVar11 = merge_clip_rect.Min.y;
                fVar10 = merge_clip_rect.Min.x;
                iVar25 = iVar25 + -1;
                pIVar19 = ImVector<ImDrawCmd>::operator[](&pIVar20->_CmdBuffer,0);
                (pIVar19->ClipRect).x = fVar10;
                (pIVar19->ClipRect).y = fVar11;
                (pIVar19->ClipRect).z = fVar12;
                (pIVar19->ClipRect).w = fVar13;
                iVar22 = (pIVar20->_CmdBuffer).Capacity;
                pIVar19 = (pIVar20->_CmdBuffer).Data;
                iVar7 = (pIVar20->_IdxBuffer).Size;
                iVar8 = (pIVar20->_IdxBuffer).Capacity;
                puVar6 = (pIVar20->_IdxBuffer).Data;
                (pIVar18->_CmdBuffer).Size = (pIVar20->_CmdBuffer).Size;
                (pIVar18->_CmdBuffer).Capacity = iVar22;
                (pIVar18->_CmdBuffer).Data = pIVar19;
                (pIVar18->_IdxBuffer).Size = iVar7;
                (pIVar18->_IdxBuffer).Capacity = iVar8;
                (pIVar18->_IdxBuffer).Data = puVar6;
                pIVar18 = pIVar18 + 1;
              }
              iVar28 = iVar28 + 1;
            }
            iVar24 = iVar24 - iVar27;
          }
          pIVar23 = pIVar23 + 2;
        }
        iVar25 = 0;
        while ((iVar25 < iVar22 && (iVar24 != 0))) {
          bVar14 = ImBitArray<130>::TestBit(&remaining_mask,iVar25);
          if (bVar14) {
            pIVar20 = ImVector<ImDrawChannel>::operator[](this,iVar25);
            iVar22 = (pIVar20->_CmdBuffer).Capacity;
            pIVar19 = (pIVar20->_CmdBuffer).Data;
            iVar27 = (pIVar20->_IdxBuffer).Size;
            iVar28 = (pIVar20->_IdxBuffer).Capacity;
            puVar6 = (pIVar20->_IdxBuffer).Data;
            (pIVar18->_CmdBuffer).Size = (pIVar20->_CmdBuffer).Size;
            (pIVar18->_CmdBuffer).Capacity = iVar22;
            (pIVar18->_CmdBuffer).Data = pIVar19;
            (pIVar18->_IdxBuffer).Size = iVar27;
            (pIVar18->_IdxBuffer).Capacity = iVar28;
            (pIVar18->_IdxBuffer).Data = puVar6;
            pIVar18 = pIVar18 + 1;
            iVar24 = iVar24 + -1;
          }
          iVar25 = iVar25 + 1;
          iVar22 = (table->DrawSplitter)._Count;
        }
        pIVar20 = (pIVar9->DrawChannelsTempMergeBuffer).Data;
        if (pIVar18 != pIVar20 + (pIVar9->DrawChannelsTempMergeBuffer).Size) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x246a,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                      "dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size"
                     );
          pIVar20 = (pIVar9->DrawChannelsTempMergeBuffer).Data;
          iVar22 = (table->DrawSplitter)._Count;
        }
        memcpy((table->DrawSplitter)._Channels.Data + 1,pIVar20,(long)iVar22 * 0x20 - 0x20);
      }
      return;
    }
    if ((table->VisibleUnclippedMaskByIndex >> (uVar26 & 0x3f) & 1) != 0) {
      pIVar17 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)uVar26);
      for (iVar24 = 0; ('\0' < cVar1) + 1 != iVar24; iVar24 = iVar24 + 1) {
        iVar22 = (int)*(char *)((long)pIVar17 + (0x5e - (ulong)(iVar24 == 0)));
        pIVar18 = ImVector<ImDrawChannel>::operator[](this,iVar22);
        if (0 < (pIVar18->_CmdBuffer).Size) {
          pIVar19 = ImVector<ImDrawCmd>::back(&pIVar18->_CmdBuffer);
          if (pIVar19->ElemCount == 0) {
            ImVector<ImDrawCmd>::pop_back(&pIVar18->_CmdBuffer);
          }
          if ((pIVar18->_CmdBuffer).Size == 1) {
            if ((pIVar17->Flags & 0x40) == 0) {
              if (cVar1 < '\x01') {
                IVar3 = pIVar17->ContentWidthRowsUnfrozen;
LAB_001c7dc9:
                uVar4 = pIVar17->ContentWidthHeadersUsed;
                sVar15 = uVar4;
                if ((short)uVar4 < IVar3) {
                  sVar15 = IVar3;
                }
              }
              else {
                if (iVar24 == 0) {
                  IVar3 = pIVar17->ContentWidthRowsFrozen;
                  goto LAB_001c7dc9;
                }
                sVar15 = pIVar17->ContentWidthRowsUnfrozen;
              }
              if (pIVar17->WidthGiven <= (float)(int)sVar15 &&
                  (float)(int)sVar15 != pIVar17->WidthGiven) goto LAB_001c7e79;
            }
            iVar25 = 2;
            if ('\0' < cVar2) {
              iVar25 = (uint)((long)table->FreezeColumnsCount <= (long)uVar26) * 2;
            }
            iVar27 = iVar24;
            if (cVar1 < '\x01') {
              iVar27 = 1;
            }
            uVar29 = (ulong)(uint)(iVar27 + iVar25);
            this_00 = (ImRect *)((long)&local_d8 + uVar29 * 0x28);
            if ((&local_c8)[uVar29 * 10] == 0) {
              (this_00->Min).x = 3.4028235e+38;
              (this_00->Min).y = 3.4028235e+38;
              *(undefined8 *)((long)&local_d8 + uVar29 * 0x28 + 8) = 0xff7fffffff7fffff;
            }
            ImBitArray<130>::SetBit(local_c4 + uVar29 * 2,iVar22);
            (&local_c8)[uVar29 * 10] = (&local_c8)[uVar29 * 10] + 1;
            pIVar19 = ImVector<ImDrawCmd>::operator[](&pIVar18->_CmdBuffer,0);
            remaining_mask.Storage[0] = (ImU32)(pIVar19->ClipRect).x;
            remaining_mask.Storage[1] = (ImU32)(pIVar19->ClipRect).y;
            remaining_mask.Storage[2] = (ImU32)(pIVar19->ClipRect).z;
            remaining_mask.Storage[3] = (ImU32)(pIVar19->ClipRect).w;
            ImRect::Add(this_00,(ImRect *)&remaining_mask);
            uVar16 = uVar16 | 1 << (iVar27 + iVar25 & 0x1fU);
          }
        }
LAB_001c7e79:
      }
      pIVar17->DrawChannelCurrent = -1;
    }
    uVar26 = uVar26 + 1;
  } while( true );
}

Assistant:

void    ImGui::TableReorderDrawChannelsForMerge(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = &table->DrawSplitter;
    const bool is_frozen_v = (table->FreezeRowsCount > 0);
    const bool is_frozen_h = (table->FreezeColumnsCount > 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];
    memset(merge_groups, 0, sizeof(merge_groups));
    bool merge_groups_all_fit_within_inner_rect = (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0;

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = is_frozen_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelRowsBeforeFreeze : column->DrawChannelRowsAfterFreeze;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column.
            if (!(column->Flags & ImGuiTableColumnFlags_NoClipX))
            {
                float width_contents;
                if (merge_group_sub_count == 1)     // No row freeze (same as testing !is_frozen_v)
                    width_contents = ImMax(column->ContentWidthRowsUnfrozen, column->ContentWidthHeadersUsed);
                else if (merge_group_sub_n == 0)    // Row freeze: use width before freeze
                    width_contents = ImMax(column->ContentWidthRowsFrozen, column->ContentWidthHeadersUsed);
                else                                // Row freeze: use width after freeze
                    width_contents = column->ContentWidthRowsUnfrozen;
                if (width_contents > column->WidthGiven)
                    continue;
            }

            const int merge_group_dst_n = (is_frozen_h && column_n < table->FreezeColumnsCount ? 0 : 2) + (is_frozen_v ? merge_group_sub_n : 1);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_dst_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_dst_n);

            // If we end with a single group and hosted by the outer window, we'll attempt to merge our draw command
            // with the existing outer window command. But we can only do so if our columns all fit within the expected
            // clip rect, otherwise clipping will be incorrect when ScrollX is disabled.
            // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column don't fit within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect

            // 2019/10/22: (1) This is breaking table_2_draw_calls but I cannot seem to repro what it is attempting to
            // fix... cf git fce2e8dc "Fixed issue with clipping when outerwindow==innerwindow / support ScrollH without ScrollV."
            // 2019/10/22: (2) Clamping code in TableUpdateLayout() seemingly made this not necessary...
#if 0
            if (column->MinX < table->InnerClipRect.Min.x || column->MaxX > table->InnerClipRect.Max.x)
                merge_groups_all_fit_within_inner_rect = false;
#endif
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelBeforeRowFreeze/DrawChannelAfterRowFreeze solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = -1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // Conceptually we want to test if only 1 bit of merge_group_mask is set, but with no freezing we know it's always going to be group 3.
        // We need to test for !is_frozen because any unfitting column will not be part of a merge group, so testing for merge_group_mask isn't enough.
        const bool may_extend_clip_rect_to_host_rect = (merge_group_mask == (1 << 3)) && !is_frozen_v && !is_frozen_h;

        // Use shared temporary storage so the allocation gets amortized
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - 1);
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask; // We need 130-bit of storage
        remaining_mask.ClearBits();
        remaining_mask.SetBitRange(1, splitter->_Count - 1); // Background channel 0 not part of the merge (see channel allocation in TableUpdateDrawChannels)
        int remaining_count = splitter->_Count - 1;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_groups[merge_group_n].ClipRect;
                if (may_extend_clip_rect_to_host_rect)
                {
                    IM_ASSERT(merge_group_n == 3);
                    //GetOverlayDrawList()->AddRect(table->HostClipRect.Min, table->HostClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 3.0f);
                    //GetOverlayDrawList()->AddRect(table->InnerClipRect.Min, table->InnerClipRect.Max, IM_COL32(0, 255, 0, 200), 0.0f, ~0, 1.0f);
                    //GetOverlayDrawList()->AddRect(merge_clip_rect.Min, merge_clip_rect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 2.0f);
                    merge_clip_rect.Add(merge_groups_all_fit_within_inner_rect ? table->HostClipRect : table->InnerClipRect);
                    //GetOverlayDrawList()->AddRect(merge_clip_rect.Min, merge_clip_rect.Max, IM_COL32(0, 255, 0, 200));
                }
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + 1, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - 1) * sizeof(ImDrawChannel));
    }
}